

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column_segment.cpp
# Opt level: O1

void duckdb::FilterSelectionSwitch<double>
               (UnifiedVectorFormat *vdata,double predicate,SelectionVector *sel,
               idx_t *approved_tuple_count,ExpressionType comparison_type)

{
  ulong uVar1;
  data_ptr_t pdVar2;
  sel_t *psVar3;
  unsigned_long *puVar4;
  bool bVar5;
  ulong uVar6;
  NotImplementedException *this;
  undefined7 in_register_00000009;
  ulong uVar7;
  idx_t iVar8;
  ulong uVar9;
  SelectionVector new_sel;
  string local_70;
  SelectionVector local_50;
  idx_t *local_38;
  
  SelectionVector::SelectionVector(&local_50,*approved_tuple_count);
  local_70._M_dataplus._M_p = (pointer)predicate;
  local_38 = approved_tuple_count;
  switch((int)CONCAT71(in_register_00000009,comparison_type)) {
  case 0x19:
    uVar1 = *approved_tuple_count;
    if ((vdata->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
        (unsigned_long *)0x0) {
      if (uVar1 != 0) {
        pdVar2 = vdata->data;
        iVar8 = 0;
        uVar7 = 0;
        do {
          uVar9 = uVar7;
          if (sel->sel_vector != (sel_t *)0x0) {
            uVar9 = (ulong)sel->sel_vector[uVar7];
          }
          psVar3 = vdata->sel->sel_vector;
          uVar6 = uVar9;
          if (psVar3 != (sel_t *)0x0) {
            uVar6 = (ulong)psVar3[uVar9];
          }
          bVar5 = Equals::Operation<double>((double *)(pdVar2 + uVar6 * 8),(double *)&local_70);
          local_50.sel_vector[iVar8] = (sel_t)uVar9;
          iVar8 = iVar8 + bVar5;
          uVar7 = uVar7 + 1;
        } while (uVar1 != uVar7);
        goto LAB_00610ebb;
      }
    }
    else if (uVar1 != 0) {
      pdVar2 = vdata->data;
      iVar8 = 0;
      uVar7 = 0;
      do {
        uVar9 = uVar7;
        if (sel->sel_vector != (sel_t *)0x0) {
          uVar9 = (ulong)sel->sel_vector[uVar7];
        }
        psVar3 = vdata->sel->sel_vector;
        uVar6 = uVar9;
        if (psVar3 != (sel_t *)0x0) {
          uVar6 = (ulong)psVar3[uVar9];
        }
        puVar4 = (vdata->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if ((puVar4 == (unsigned_long *)0x0) || ((puVar4[uVar6 >> 6] >> (uVar6 & 0x3f) & 1) != 0)) {
          bVar5 = Equals::Operation<double>((double *)(pdVar2 + uVar6 * 8),(double *)&local_70);
          uVar6 = (ulong)bVar5;
        }
        else {
          uVar6 = 0;
        }
        local_50.sel_vector[iVar8] = (sel_t)uVar9;
        iVar8 = iVar8 + uVar6;
        uVar7 = uVar7 + 1;
      } while (uVar1 != uVar7);
      goto LAB_00610ebb;
    }
    break;
  case 0x1a:
    uVar1 = *approved_tuple_count;
    if ((vdata->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
        (unsigned_long *)0x0) {
      if (uVar1 != 0) {
        pdVar2 = vdata->data;
        iVar8 = 0;
        uVar7 = 0;
        do {
          uVar9 = uVar7;
          if (sel->sel_vector != (sel_t *)0x0) {
            uVar9 = (ulong)sel->sel_vector[uVar7];
          }
          psVar3 = vdata->sel->sel_vector;
          uVar6 = uVar9;
          if (psVar3 != (sel_t *)0x0) {
            uVar6 = (ulong)psVar3[uVar9];
          }
          bVar5 = Equals::Operation<double>((double *)(pdVar2 + uVar6 * 8),(double *)&local_70);
          local_50.sel_vector[iVar8] = (sel_t)uVar9;
          iVar8 = iVar8 + !bVar5;
          uVar7 = uVar7 + 1;
        } while (uVar1 != uVar7);
        goto LAB_00610ebb;
      }
    }
    else if (uVar1 != 0) {
      pdVar2 = vdata->data;
      iVar8 = 0;
      uVar7 = 0;
      do {
        uVar9 = uVar7;
        if (sel->sel_vector != (sel_t *)0x0) {
          uVar9 = (ulong)sel->sel_vector[uVar7];
        }
        psVar3 = vdata->sel->sel_vector;
        uVar6 = uVar9;
        if (psVar3 != (sel_t *)0x0) {
          uVar6 = (ulong)psVar3[uVar9];
        }
        puVar4 = (vdata->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if ((puVar4 == (unsigned_long *)0x0) || ((puVar4[uVar6 >> 6] >> (uVar6 & 0x3f) & 1) != 0)) {
          bVar5 = Equals::Operation<double>((double *)(pdVar2 + uVar6 * 8),(double *)&local_70);
          uVar6 = (ulong)!bVar5;
        }
        else {
          uVar6 = 0;
        }
        local_50.sel_vector[iVar8] = (sel_t)uVar9;
        iVar8 = iVar8 + uVar6;
        uVar7 = uVar7 + 1;
      } while (uVar1 != uVar7);
      goto LAB_00610ebb;
    }
    break;
  case 0x1b:
    uVar1 = *approved_tuple_count;
    if ((vdata->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
        (unsigned_long *)0x0) {
      if (uVar1 != 0) {
        pdVar2 = vdata->data;
        iVar8 = 0;
        uVar7 = 0;
        do {
          uVar9 = uVar7;
          if (sel->sel_vector != (sel_t *)0x0) {
            uVar9 = (ulong)sel->sel_vector[uVar7];
          }
          psVar3 = vdata->sel->sel_vector;
          uVar6 = uVar9;
          if (psVar3 != (sel_t *)0x0) {
            uVar6 = (ulong)psVar3[uVar9];
          }
          bVar5 = GreaterThan::Operation<double>((double *)&local_70,(double *)(pdVar2 + uVar6 * 8))
          ;
          local_50.sel_vector[iVar8] = (sel_t)uVar9;
          iVar8 = iVar8 + bVar5;
          uVar7 = uVar7 + 1;
        } while (uVar1 != uVar7);
        goto LAB_00610ebb;
      }
    }
    else if (uVar1 != 0) {
      pdVar2 = vdata->data;
      iVar8 = 0;
      uVar7 = 0;
      do {
        uVar9 = uVar7;
        if (sel->sel_vector != (sel_t *)0x0) {
          uVar9 = (ulong)sel->sel_vector[uVar7];
        }
        psVar3 = vdata->sel->sel_vector;
        uVar6 = uVar9;
        if (psVar3 != (sel_t *)0x0) {
          uVar6 = (ulong)psVar3[uVar9];
        }
        puVar4 = (vdata->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if ((puVar4 == (unsigned_long *)0x0) || ((puVar4[uVar6 >> 6] >> (uVar6 & 0x3f) & 1) != 0)) {
          bVar5 = GreaterThan::Operation<double>((double *)&local_70,(double *)(pdVar2 + uVar6 * 8))
          ;
          uVar6 = (ulong)bVar5;
        }
        else {
          uVar6 = 0;
        }
        local_50.sel_vector[iVar8] = (sel_t)uVar9;
        iVar8 = iVar8 + uVar6;
        uVar7 = uVar7 + 1;
      } while (uVar1 != uVar7);
      goto LAB_00610ebb;
    }
    break;
  case 0x1c:
    uVar1 = *approved_tuple_count;
    if ((vdata->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
        (unsigned_long *)0x0) {
      if (uVar1 != 0) {
        pdVar2 = vdata->data;
        iVar8 = 0;
        uVar7 = 0;
        do {
          uVar9 = uVar7;
          if (sel->sel_vector != (sel_t *)0x0) {
            uVar9 = (ulong)sel->sel_vector[uVar7];
          }
          psVar3 = vdata->sel->sel_vector;
          uVar6 = uVar9;
          if (psVar3 != (sel_t *)0x0) {
            uVar6 = (ulong)psVar3[uVar9];
          }
          bVar5 = GreaterThan::Operation<double>((double *)(pdVar2 + uVar6 * 8),(double *)&local_70)
          ;
          local_50.sel_vector[iVar8] = (sel_t)uVar9;
          iVar8 = iVar8 + bVar5;
          uVar7 = uVar7 + 1;
        } while (uVar1 != uVar7);
        goto LAB_00610ebb;
      }
    }
    else if (uVar1 != 0) {
      pdVar2 = vdata->data;
      iVar8 = 0;
      uVar7 = 0;
      do {
        uVar9 = uVar7;
        if (sel->sel_vector != (sel_t *)0x0) {
          uVar9 = (ulong)sel->sel_vector[uVar7];
        }
        psVar3 = vdata->sel->sel_vector;
        uVar6 = uVar9;
        if (psVar3 != (sel_t *)0x0) {
          uVar6 = (ulong)psVar3[uVar9];
        }
        puVar4 = (vdata->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if ((puVar4 == (unsigned_long *)0x0) || ((puVar4[uVar6 >> 6] >> (uVar6 & 0x3f) & 1) != 0)) {
          bVar5 = GreaterThan::Operation<double>((double *)(pdVar2 + uVar6 * 8),(double *)&local_70)
          ;
          uVar6 = (ulong)bVar5;
        }
        else {
          uVar6 = 0;
        }
        local_50.sel_vector[iVar8] = (sel_t)uVar9;
        iVar8 = iVar8 + uVar6;
        uVar7 = uVar7 + 1;
      } while (uVar1 != uVar7);
      goto LAB_00610ebb;
    }
    break;
  case 0x1d:
    uVar1 = *approved_tuple_count;
    if ((vdata->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
        (unsigned_long *)0x0) {
      if (uVar1 != 0) {
        pdVar2 = vdata->data;
        iVar8 = 0;
        uVar7 = 0;
        do {
          uVar9 = uVar7;
          if (sel->sel_vector != (sel_t *)0x0) {
            uVar9 = (ulong)sel->sel_vector[uVar7];
          }
          psVar3 = vdata->sel->sel_vector;
          uVar6 = uVar9;
          if (psVar3 != (sel_t *)0x0) {
            uVar6 = (ulong)psVar3[uVar9];
          }
          bVar5 = GreaterThan::Operation<double>((double *)(pdVar2 + uVar6 * 8),(double *)&local_70)
          ;
          local_50.sel_vector[iVar8] = (sel_t)uVar9;
          iVar8 = iVar8 + !bVar5;
          uVar7 = uVar7 + 1;
        } while (uVar1 != uVar7);
        goto LAB_00610ebb;
      }
    }
    else if (uVar1 != 0) {
      pdVar2 = vdata->data;
      iVar8 = 0;
      uVar7 = 0;
      do {
        uVar9 = uVar7;
        if (sel->sel_vector != (sel_t *)0x0) {
          uVar9 = (ulong)sel->sel_vector[uVar7];
        }
        psVar3 = vdata->sel->sel_vector;
        uVar6 = uVar9;
        if (psVar3 != (sel_t *)0x0) {
          uVar6 = (ulong)psVar3[uVar9];
        }
        puVar4 = (vdata->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if ((puVar4 == (unsigned_long *)0x0) || ((puVar4[uVar6 >> 6] >> (uVar6 & 0x3f) & 1) != 0)) {
          bVar5 = GreaterThan::Operation<double>((double *)(pdVar2 + uVar6 * 8),(double *)&local_70)
          ;
          uVar6 = (ulong)!bVar5;
        }
        else {
          uVar6 = 0;
        }
        local_50.sel_vector[iVar8] = (sel_t)uVar9;
        iVar8 = iVar8 + uVar6;
        uVar7 = uVar7 + 1;
      } while (uVar1 != uVar7);
      goto LAB_00610ebb;
    }
    break;
  case 0x1e:
    uVar1 = *approved_tuple_count;
    if ((vdata->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
        (unsigned_long *)0x0) {
      if (uVar1 != 0) {
        pdVar2 = vdata->data;
        iVar8 = 0;
        uVar7 = 0;
        do {
          uVar9 = uVar7;
          if (sel->sel_vector != (sel_t *)0x0) {
            uVar9 = (ulong)sel->sel_vector[uVar7];
          }
          psVar3 = vdata->sel->sel_vector;
          uVar6 = uVar9;
          if (psVar3 != (sel_t *)0x0) {
            uVar6 = (ulong)psVar3[uVar9];
          }
          bVar5 = GreaterThanEquals::Operation<double>
                            ((double *)(pdVar2 + uVar6 * 8),(double *)&local_70);
          local_50.sel_vector[iVar8] = (sel_t)uVar9;
          iVar8 = iVar8 + bVar5;
          uVar7 = uVar7 + 1;
        } while (uVar1 != uVar7);
        goto LAB_00610ebb;
      }
    }
    else if (uVar1 != 0) {
      pdVar2 = vdata->data;
      iVar8 = 0;
      uVar7 = 0;
      do {
        uVar9 = uVar7;
        if (sel->sel_vector != (sel_t *)0x0) {
          uVar9 = (ulong)sel->sel_vector[uVar7];
        }
        psVar3 = vdata->sel->sel_vector;
        uVar6 = uVar9;
        if (psVar3 != (sel_t *)0x0) {
          uVar6 = (ulong)psVar3[uVar9];
        }
        puVar4 = (vdata->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if ((puVar4 == (unsigned_long *)0x0) || ((puVar4[uVar6 >> 6] >> (uVar6 & 0x3f) & 1) != 0)) {
          bVar5 = GreaterThanEquals::Operation<double>
                            ((double *)(pdVar2 + uVar6 * 8),(double *)&local_70);
          uVar6 = (ulong)bVar5;
        }
        else {
          uVar6 = 0;
        }
        local_50.sel_vector[iVar8] = (sel_t)uVar9;
        iVar8 = iVar8 + uVar6;
        uVar7 = uVar7 + 1;
      } while (uVar1 != uVar7);
      goto LAB_00610ebb;
    }
    break;
  default:
    this = (NotImplementedException *)__cxa_allocate_exception(0x10);
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_70,"Unknown comparison type for filter pushed down to table!","");
    NotImplementedException::NotImplementedException(this,&local_70);
    __cxa_throw(this,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
  }
  iVar8 = 0;
LAB_00610ebb:
  *local_38 = iVar8;
  shared_ptr<duckdb::SelectionData,_true>::operator=(&sel->selection_data,&local_50.selection_data);
  sel->sel_vector = local_50.sel_vector;
  if (local_50.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_50.selection_data.internal.
               super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  return;
}

Assistant:

static void FilterSelectionSwitch(UnifiedVectorFormat &vdata, T predicate, SelectionVector &sel,
                                  idx_t &approved_tuple_count, ExpressionType comparison_type) {
	SelectionVector new_sel(approved_tuple_count);
	auto &mask = vdata.validity;
	// the inplace loops take the result as the last parameter
	switch (comparison_type) {
	case ExpressionType::COMPARE_EQUAL: {
		if (mask.AllValid()) {
			approved_tuple_count =
			    TemplatedFilterSelection<T, Equals, false>(vdata, predicate, sel, approved_tuple_count, new_sel);
		} else {
			approved_tuple_count =
			    TemplatedFilterSelection<T, Equals, true>(vdata, predicate, sel, approved_tuple_count, new_sel);
		}
		break;
	}
	case ExpressionType::COMPARE_NOTEQUAL: {
		if (mask.AllValid()) {
			approved_tuple_count =
			    TemplatedFilterSelection<T, NotEquals, false>(vdata, predicate, sel, approved_tuple_count, new_sel);
		} else {
			approved_tuple_count =
			    TemplatedFilterSelection<T, NotEquals, true>(vdata, predicate, sel, approved_tuple_count, new_sel);
		}
		break;
	}
	case ExpressionType::COMPARE_LESSTHAN: {
		if (mask.AllValid()) {
			approved_tuple_count =
			    TemplatedFilterSelection<T, LessThan, false>(vdata, predicate, sel, approved_tuple_count, new_sel);
		} else {
			approved_tuple_count =
			    TemplatedFilterSelection<T, LessThan, true>(vdata, predicate, sel, approved_tuple_count, new_sel);
		}
		break;
	}
	case ExpressionType::COMPARE_GREATERTHAN: {
		if (mask.AllValid()) {
			approved_tuple_count =
			    TemplatedFilterSelection<T, GreaterThan, false>(vdata, predicate, sel, approved_tuple_count, new_sel);
		} else {
			approved_tuple_count =
			    TemplatedFilterSelection<T, GreaterThan, true>(vdata, predicate, sel, approved_tuple_count, new_sel);
		}
		break;
	}
	case ExpressionType::COMPARE_LESSTHANOREQUALTO: {
		if (mask.AllValid()) {
			approved_tuple_count = TemplatedFilterSelection<T, LessThanEquals, false>(vdata, predicate, sel,
			                                                                          approved_tuple_count, new_sel);
		} else {
			approved_tuple_count =
			    TemplatedFilterSelection<T, LessThanEquals, true>(vdata, predicate, sel, approved_tuple_count, new_sel);
		}
		break;
	}
	case ExpressionType::COMPARE_GREATERTHANOREQUALTO: {
		if (mask.AllValid()) {
			approved_tuple_count = TemplatedFilterSelection<T, GreaterThanEquals, false>(vdata, predicate, sel,
			                                                                             approved_tuple_count, new_sel);
		} else {
			approved_tuple_count = TemplatedFilterSelection<T, GreaterThanEquals, true>(vdata, predicate, sel,
			                                                                            approved_tuple_count, new_sel);
		}
		break;
	}
	default:
		throw NotImplementedException("Unknown comparison type for filter pushed down to table!");
	}
	sel.Initialize(new_sel);
}